

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O2

bool __thiscall
slang::DiagnosticEngine::issueImpl
          (DiagnosticEngine *this,Diagnostic *diagnostic,DiagnosticSeverity severity)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  int iVar3;
  pointer pSVar4;
  SourceManager *this_00;
  ulong uVar5;
  pointer psVar6;
  DiagnosticEngine *pDVar7;
  uint uVar8;
  bool bVar9;
  strong_ordering sVar10;
  DiagnosticSeverity DVar11;
  SourceLocation SVar12;
  value_type *elements;
  ulong pos0;
  DiagnosticEngine *ctx;
  uint uVar13;
  ulong hash;
  ulong uVar14;
  undefined1 uVar15;
  uint uVar16;
  shared_ptr<slang::DiagnosticClient> *client;
  __extent_storage<18446744073709551615UL> _Var17;
  SourceLocation SVar18;
  pointer psVar19;
  DiagnosticEngine *diagnostic_00;
  long lVar20;
  ulong uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  byte bVar25;
  undefined1 auVar26 [16];
  span<const_slang::SourceRange,_18446744073709551615UL> ranges;
  SourceLocation loc;
  string message;
  SmallVector<slang::SourceLocation,_8UL> expansionLocs;
  anon_class_8_1_8991fb9c checkSuppressed;
  SourceLocation local_188;
  ulong local_180;
  SourceLocation local_178;
  DiagnosticSeverity local_16c;
  string local_168;
  undefined8 local_148;
  undefined8 local_140;
  uchar local_138;
  uchar uStack_137;
  uchar uStack_136;
  byte bStack_135;
  uchar uStack_134;
  uchar uStack_133;
  uchar uStack_132;
  byte bStack_131;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  byte bStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  byte bStack_129;
  SmallVectorBase<slang::SourceLocation> local_120 [2];
  undefined1 local_c8 [8];
  pointer local_c0;
  BufferID *local_b8;
  long local_b0;
  size_t local_a8;
  SourceLocation local_a0;
  group_type_pointer local_98;
  SourceLocation local_90;
  DiagnosticSeverity local_88;
  undefined1 local_84;
  
  local_120[0].data_ = (pointer)local_120[0].firstElement;
  local_120[0].len = 0;
  local_120[0].cap = 8;
  local_188 = diagnostic->location;
  local_178 = (SourceLocation)diagnostic;
  local_16c = severity;
  if (local_188 == (SourceLocation)0xffffffffffffffff) {
    uVar15 = 0;
    local_180 = 0;
  }
  else {
    local_180 = 0;
    while (bVar9 = SourceManager::isMacroLoc(this->sourceManager,local_188), SVar12 = local_188,
          bVar9) {
      bVar9 = SourceManager::isMacroArgLoc(this->sourceManager,local_188);
      if (bVar9) {
        local_c8 = (undefined1  [8])SourceManager::getExpansionLoc(this->sourceManager,local_188);
        SmallVectorBase<slang::SourceLocation>::emplace_back<slang::SourceLocation>
                  (local_120,(SourceLocation *)local_c8);
        local_188 = SourceManager::getOriginalLoc(this->sourceManager,local_188);
      }
      else {
        SmallVectorBase<slang::SourceLocation>::emplace_back<slang::SourceLocation_const&>
                  (local_120,&local_188);
        local_188 = SourceManager::getExpansionLoc(this->sourceManager,local_188);
      }
      pSVar4 = *(pointer *)((long)local_178 + 0x18);
      lVar20 = *(long *)((long)local_178 + 0x20);
      this_00 = this->sourceManager;
      bVar9 = SourceManager::isMacroArgLoc(this_00,SVar12);
      if (bVar9) {
        SVar12 = SourceManager::getExpansionLoc(this_00,SVar12);
        _Var17._M_extent_value = lVar20 - (long)pSVar4 >> 4;
        local_c8 = (undefined1  [8])&local_b0;
        local_c0 = (pointer)0x0;
        local_b8 = (BufferID *)0x8;
        ranges._M_extent._M_extent_value = _Var17._M_extent_value;
        ranges._M_ptr = pSVar4;
        local_168._M_dataplus._M_p = (pointer)SVar12;
        mapSourceRanges(this,SVar12,ranges,(SmallVectorBase<slang::SourceRange> *)local_c8,false);
        if (local_c0 < _Var17._M_extent_value) {
LAB_00278a1e:
          bVar9 = false;
        }
        else {
          lVar20 = (long)local_c0 << 4;
          SVar18 = (SourceLocation)local_c8;
          do {
            bVar9 = lVar20 == 0;
            if (bVar9) break;
            local_140 = *(undefined8 *)SVar18;
            SVar12 = (SourceLocation)&local_140;
            sVar10 = SourceLocation::operator<=>
                               ((SourceLocation *)&local_168,(SourceLocation *)SVar12);
            if (sVar10._M_value < '\0') goto LAB_00278a1e;
            local_148 = *(undefined8 *)((long)SVar18 + 8);
            SVar12 = (SourceLocation)&local_148;
            sVar10 = SourceLocation::operator<=>
                               ((SourceLocation *)&local_168,(SourceLocation *)SVar12);
            SVar18 = (SourceLocation)((long)SVar18 + 0x10);
            lVar20 = lVar20 + -0x10;
          } while (sVar10._M_value < '\0');
        }
        SmallVectorBase<slang::SourceRange>::cleanup
                  ((SmallVectorBase<slang::SourceRange> *)local_c8,(EVP_PKEY_CTX *)SVar12);
        if (bVar9) {
          local_180 = local_120[0].len;
        }
      }
    }
    uVar13 = local_188._0_4_ & 0xfffffff;
    local_168._M_dataplus._M_p =
         (pointer)(CONCAT44(local_168._M_dataplus._M_p._4_4_,local_188._0_4_) & 0xffffffff0fffffff);
    auVar26 = ZEXT416(uVar13) * ZEXT816(0x9e3779b97f4a7c15);
    hash = auVar26._8_8_ ^ auVar26._0_8_;
    pos0 = hash >> ((byte)(this->reportedIncludeStack).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                          .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    uVar5 = (this->reportedIncludeStack).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
            .arrays.groups_size_mask;
    uVar14 = 0;
    uVar21 = pos0;
    do {
      pgVar1 = (this->reportedIncludeStack).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
               .arrays.groups_ + uVar21;
      local_138 = pgVar1->m[0].n;
      uStack_137 = pgVar1->m[1].n;
      uStack_136 = pgVar1->m[2].n;
      bStack_135 = pgVar1->m[3].n;
      uStack_134 = pgVar1->m[4].n;
      uStack_133 = pgVar1->m[5].n;
      uStack_132 = pgVar1->m[6].n;
      bStack_131 = pgVar1->m[7].n;
      uStack_130 = pgVar1->m[8].n;
      uStack_12f = pgVar1->m[9].n;
      uStack_12e = pgVar1->m[10].n;
      bStack_12d = pgVar1->m[0xb].n;
      uStack_12c = pgVar1->m[0xc].n;
      uStack_12b = pgVar1->m[0xd].n;
      uStack_12a = pgVar1->m[0xe].n;
      bStack_129 = pgVar1->m[0xf].n;
      uVar22 = (uchar)uVar2;
      auVar26[0] = -(local_138 == uVar22);
      uVar23 = (uchar)((uint)uVar2 >> 8);
      auVar26[1] = -(uStack_137 == uVar23);
      uVar24 = (uchar)((uint)uVar2 >> 0x10);
      auVar26[2] = -(uStack_136 == uVar24);
      bVar25 = (byte)((uint)uVar2 >> 0x18);
      auVar26[3] = -(bStack_135 == bVar25);
      auVar26[4] = -(uStack_134 == uVar22);
      auVar26[5] = -(uStack_133 == uVar23);
      auVar26[6] = -(uStack_132 == uVar24);
      auVar26[7] = -(bStack_131 == bVar25);
      auVar26[8] = -(uStack_130 == uVar22);
      auVar26[9] = -(uStack_12f == uVar23);
      auVar26[10] = -(uStack_12e == uVar24);
      auVar26[0xb] = -(bStack_12d == bVar25);
      auVar26[0xc] = -(uStack_12c == uVar22);
      auVar26[0xd] = -(uStack_12b == uVar23);
      auVar26[0xe] = -(uStack_12a == uVar24);
      auVar26[0xf] = -(bStack_129 == bVar25);
      for (uVar16 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe); uVar16 != 0;
          uVar16 = uVar16 - 1 & uVar16) {
        uVar8 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        if (uVar13 == (this->reportedIncludeStack).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                      .arrays.elements_[uVar21 * 0xf + (ulong)uVar8].id) {
          uVar15 = 0;
          goto LAB_00278bb6;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_129) == 0) break;
      lVar20 = uVar21 + uVar14;
      uVar14 = uVar14 + 1;
      uVar21 = lVar20 + 1U & uVar5;
    } while (uVar14 <= uVar5);
    if ((this->reportedIncludeStack).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
        .size_ctrl.size <
        (this->reportedIncludeStack).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
      ::unchecked_emplace_at<slang::BufferID>
                ((locator *)local_c8,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                  *)&this->reportedIncludeStack,pos0,hash,(BufferID *)&local_168);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
      ::unchecked_emplace_with_rehash<slang::BufferID>
                ((locator *)local_c8,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                  *)&this->reportedIncludeStack,hash,(BufferID *)&local_168);
    }
    uVar15 = 1;
LAB_00278bb6:
    local_c8 = (undefined1  [8])this;
    DVar11 = getDefaultSeverity(*(DiagCode *)((long)local_178 + 0x58));
    if (DVar11 == Warning) {
      ctx = (DiagnosticEngine *)&this->ignoreWarnPatterns;
      bVar9 = issueImpl::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)local_c8,
                         (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                          *)ctx,local_188);
      if (bVar9) {
LAB_00278bec:
        bVar9 = false;
        goto LAB_00278d2d;
      }
      if ((local_180 < local_120[0].len) &&
         ((this->ignoreMacroWarnPatterns).
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->ignoreMacroWarnPatterns).
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        SVar12 = SourceManager::getFullyOriginalLoc
                           (this->sourceManager,local_120[0].data_[local_180]);
        ctx = (DiagnosticEngine *)&this->ignoreMacroWarnPatterns;
        bVar9 = issueImpl::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)local_c8,
                           (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                            *)ctx,SVar12);
        if (bVar9) goto LAB_00278bec;
      }
    }
  }
  SVar12 = local_178;
  ctx = this;
  formatMessage_abi_cxx11_(&local_168,this,(Diagnostic *)local_178);
  local_c8 = (undefined1  [8])SVar12;
  local_b8 = (BufferID *)(local_120[0].len - local_180);
  local_c0 = local_120[0].data_ + local_180;
  local_b0 = *(long *)((long)SVar12 + 0x18);
  local_a8 = *(long *)((long)SVar12 + 0x20) - local_b0 >> 4;
  local_a0 = local_188;
  local_88 = local_16c;
  local_98 = (group_type_pointer)local_168._M_string_length;
  local_90 = (SourceLocation)local_168._M_dataplus._M_p;
  psVar6 = (this->clients).
           super__Vector_base<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_84 = uVar15;
  for (psVar19 = (this->clients).
                 super__Vector_base<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar19 != psVar6; psVar19 = psVar19 + 1
      ) {
    ctx = (DiagnosticEngine *)local_c8;
    (*((psVar19->super___shared_ptr<slang::DiagnosticClient,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      _vptr_DiagnosticClient[2])();
  }
  pDVar7 = *(DiagnosticEngine **)((long)local_178 + 0x38);
  for (diagnostic_00 = *(DiagnosticEngine **)((long)local_178 + 0x30); diagnostic_00 != pDVar7;
      diagnostic_00 =
           (DiagnosticEngine *)
           &(diagnostic_00->messageTable).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::__cxx11::basic_string<char>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::__cxx11::basic_string<char>_>_>_>
            .size_ctrl) {
    if ((((diagnostic_00->messageTable).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::__cxx11::basic_string<char>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::__cxx11::basic_string<char>_>_>_>
          .arrays.groups_ != (group_type_pointer)0xffffffffffffffff) ||
        (iVar3 = (int)(diagnostic_00->messageTable).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::__cxx11::basic_string<char>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::__cxx11::basic_string<char>_>_>_>
                      .arrays.groups_size_mask, iVar3 == 0xe70006)) || (iVar3 == 0x80001)) {
      ctx = diagnostic_00;
      issue(this,(Diagnostic *)diagnostic_00);
    }
  }
  std::__cxx11::string::~string((string *)&local_168);
  bVar9 = true;
LAB_00278d2d:
  SmallVectorBase<slang::SourceLocation>::cleanup(local_120,(EVP_PKEY_CTX *)ctx);
  return bVar9;
}

Assistant:

bool DiagnosticEngine::issueImpl(const Diagnostic& diagnostic, DiagnosticSeverity severity) {
    // Walk out until we find a location for this diagnostic that isn't inside a macro.
    SmallVector<SourceLocation, 8> expansionLocs;
    SourceLocation loc = diagnostic.location;
    size_t ignoreExpansionsUntil = 0;
    bool showIncludeStack = false;

    if (loc != SourceLocation::NoLocation) {
        while (sourceManager.isMacroLoc(loc)) {
            SourceLocation prevLoc = loc;
            if (sourceManager.isMacroArgLoc(loc)) {
                expansionLocs.push_back(sourceManager.getExpansionLoc(loc));
                loc = sourceManager.getOriginalLoc(loc);
            }
            else {
                expansionLocs.push_back(loc);
                loc = sourceManager.getExpansionLoc(loc);
            }

            if (checkMacroArgRanges(*this, prevLoc, diagnostic.ranges))
                ignoreExpansionsUntil = expansionLocs.size();
        }

        showIncludeStack = reportedIncludeStack.emplace(loc.buffer()).second;

        auto checkSuppressed = [&](const std::vector<fs::path>& patterns, SourceLocation loc) {
            if (patterns.empty())
                return false;

            auto& path = sourceManager.getFullPath(loc.buffer());
            for (auto& pattern : patterns) {
                if (svGlobMatches(path, pattern))
                    return true;
            }
            return false;
        };

        if (getDefaultSeverity(diagnostic.code) == DiagnosticSeverity::Warning) {
            if (checkSuppressed(ignoreWarnPatterns, loc))
                return false;

            if (ignoreExpansionsUntil < expansionLocs.size() && !ignoreMacroWarnPatterns.empty()) {
                auto originalLoc = sourceManager.getFullyOriginalLoc(
                    expansionLocs[ignoreExpansionsUntil]);

                if (checkSuppressed(ignoreMacroWarnPatterns, originalLoc))
                    return false;
            }
        }
    }

    std::string message = formatMessage(diagnostic);

    ReportedDiagnostic report(diagnostic);
    report.expansionLocs = std::span<SourceLocation>(expansionLocs).subspan(ignoreExpansionsUntil);
    report.ranges = diagnostic.ranges;
    report.location = loc;
    report.severity = severity;
    report.formattedMessage = message;
    report.shouldShowIncludeStack = showIncludeStack;

    for (auto& client : clients)
        client->report(report);

    // Notes are ignored if location is "NoLocation" since they frequently make no
    // sense without location information.
    for (const Diagnostic& note : diagnostic.notes) {
        // At some point we should figure out how to not hardcode these special cases
        // that allow notes to be issued without a location.
        if (note.location != SourceLocation::NoLocation || note.code == diag::NoteFromHere2 ||
            note.code == diag::NoteUdpCoverage) {
            issue(note);
        }
    }

    return true;
}